

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_7,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar2 = evalCtx->in[1].m_data[0];
    fVar3 = evalCtx->in[1].m_data[1];
    fVar4 = evalCtx->in[1].m_data[2];
    fVar5 = evalCtx->in[1].m_data[3];
    fVar6 = evalCtx->in[0].m_data[0];
    fVar7 = evalCtx->in[0].m_data[1];
    fVar8 = evalCtx->in[0].m_data[2];
    fVar9 = evalCtx->in[0].m_data[3];
  }
  else {
    fVar2 = -1.1;
    fVar3 = -0.6;
    fVar4 = -0.6;
    fVar5 = -0.1;
    fVar6 = -0.6;
    fVar7 = -0.6;
    fVar8 = -0.2;
    fVar9 = -0.1;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    fVar10 = (evalCtx->coords).m_data[0];
    fVar11 = (evalCtx->coords).m_data[1];
  }
  else {
    fVar10 = 0.5;
    fVar11 = 1.0;
  }
  local_28 = CONCAT44(fVar7 * fVar10 + 0.0 + fVar3 * fVar11,fVar6 * fVar10 + 0.0 + fVar2 * fVar11);
  local_20 = fVar9 * fVar10 + 0.0 + fVar5 * fVar11 + fVar8 * fVar10 + 0.0 + fVar4 * fVar11;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}